

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O2

void __thiscall AsyncRgbLedAnalyzer::~AsyncRgbLedAnalyzer(AsyncRgbLedAnalyzer *this)

{
  *(undefined ***)this = &PTR__AsyncRgbLedAnalyzer_0010dc98;
  Analyzer::KillThread();
  AsyncRgbLedSimulationDataGenerator::~AsyncRgbLedSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  std::unique_ptr<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>::
  ~unique_ptr(&this->mResults);
  std::unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>::
  ~unique_ptr(&this->mSettings);
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

AsyncRgbLedAnalyzer::~AsyncRgbLedAnalyzer()
{
    KillThread();
}